

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_skip_parens_token(JSParseState *s,int *pbits,BOOL no_line_terminator)

{
  long lVar1;
  BOOL BVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int in_EDX;
  uint *in_RSI;
  JSParseState *in_RDI;
  int bits;
  int tok_len;
  int c;
  int tok;
  int last_tok;
  JSParsePos pos;
  size_t level;
  char state [256];
  JSToken *in_stack_fffffffffffffe98;
  uint uVar6;
  int local_158;
  int local_150;
  int local_14c;
  JSParsePos local_148;
  undefined8 local_130;
  undefined1 auStack_128 [8];
  uint8_t *in_stack_fffffffffffffee0;
  JSParseState *in_stack_fffffffffffffee8;
  JSParseState *in_stack_fffffffffffffef8;
  JSParseState *in_stack_ffffffffffffff48;
  int local_4;
  
  local_150 = -0x56;
  uVar6 = 0;
  local_130 = 1;
  auStack_128[0] = 0;
  js_parse_get_pos(in_RDI,&local_148);
  local_14c = 0;
  do {
    iVar4 = (in_RDI->token).val;
    if (iVar4 == -0x7e) {
LAB_001921c2:
      if ((in_RDI->token).u.str.sep != 0x60) {
        if (0xff < local_130) goto LAB_00192363;
        auStack_128[local_130] = 0x60;
        local_130 = local_130 + 1;
      }
    }
    else if (iVar4 == -0x7a) {
      local_158 = 2;
LAB_00192249:
      BVar2 = is_regexp_allowed(local_14c);
      if (BVar2 != 0) {
        in_RDI->buf_ptr = in_RDI->buf_ptr + -(long)local_158;
        iVar3 = js_parse_regexp(in_stack_ffffffffffffff48);
        if (iVar3 != 0) goto LAB_00192363;
      }
    }
    else if (iVar4 == -0x5b) {
      if (local_130 == 2) {
        uVar6 = uVar6 | 2;
      }
    }
    else {
      if (iVar4 == -0x56) goto LAB_00192363;
      if (iVar4 == 0x28) goto LAB_001920a8;
      if (iVar4 == 0x29) {
        uVar5 = local_130 - 1;
        lVar1 = local_130 - 1;
        local_130 = uVar5;
        if (auStack_128[lVar1] != '(') goto LAB_00192363;
      }
      else {
        if (iVar4 == 0x2f) {
          local_158 = 1;
          goto LAB_00192249;
        }
        if (iVar4 == 0x3b) {
          if (local_130 == 2) {
            uVar6 = uVar6 | 1;
          }
        }
        else if (iVar4 == 0x3d) {
          uVar6 = uVar6 | 4;
        }
        else if (iVar4 == 0x5b) {
LAB_001920a8:
          if (0xff < local_130) goto LAB_00192363;
          auStack_128[local_130] = (char)(in_RDI->token).val;
          local_130 = local_130 + 1;
        }
        else if (iVar4 == 0x5d) {
          uVar5 = local_130 - 1;
          lVar1 = local_130 - 1;
          local_130 = uVar5;
          if (auStack_128[lVar1] != '[') goto LAB_00192363;
        }
        else {
          if (iVar4 == 0x7b) goto LAB_001920a8;
          if (iVar4 == 0x7d) {
            uVar5 = local_130 - 1;
            lVar1 = local_130 - 1;
            local_130 = uVar5;
            if (auStack_128[lVar1] == '`') {
              free_token((JSParseState *)CONCAT44(uVar6,0x7d),in_stack_fffffffffffffe98);
              in_RDI->got_lf = 0;
              in_RDI->last_line_num = (in_RDI->token).line_num;
              iVar3 = js_parse_template_part(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
              if (iVar3 == 0) goto LAB_001921c2;
              goto LAB_00192363;
            }
            if (auStack_128[lVar1] != '{') goto LAB_00192363;
          }
        }
      }
    }
    if (((in_RDI->token).val == -0x7d) &&
       ((BVar2 = token_is_pseudo_keyword(in_RDI,0x43), BVar2 != 0 ||
        (BVar2 = token_is_pseudo_keyword(in_RDI,0x2d), BVar2 != 0)))) {
      local_14c = -0x27;
    }
    else {
      local_14c = (in_RDI->token).val;
    }
    iVar3 = next_token(in_stack_fffffffffffffef8);
    if (iVar3 != 0) goto LAB_00192363;
  } while (1 < local_130);
  local_150 = (in_RDI->token).val;
  BVar2 = token_is_pseudo_keyword(in_RDI,0x43);
  if (BVar2 != 0) {
    local_150 = -0x27;
  }
  if ((in_EDX != 0) && (in_RDI->last_line_num != (in_RDI->token).line_num)) {
    local_150 = 10;
  }
LAB_00192363:
  if (in_RSI != (uint *)0x0) {
    *in_RSI = uVar6;
  }
  iVar4 = js_parse_seek_token((JSParseState *)CONCAT44(uVar6,iVar4),
                              (JSParsePos *)in_stack_fffffffffffffe98);
  if (iVar4 == 0) {
    local_4 = local_150;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int js_parse_skip_parens_token(JSParseState *s, int *pbits, BOOL no_line_terminator)
{
    char state[256];
    size_t level = 0;
    JSParsePos pos;
    int last_tok, tok = TOK_EOF;
    int c, tok_len, bits = 0;

    /* protect from underflow */
    state[level++] = 0;

    js_parse_get_pos(s, &pos);
    last_tok = 0;
    for (;;) {
        switch(s->token.val) {
        case '(':
        case '[':
        case '{':
            if (level >= sizeof(state))
                goto done;
            state[level++] = s->token.val;
            break;
        case ')':
            if (state[--level] != '(')
                goto done;
            break;
        case ']':
            if (state[--level] != '[')
                goto done;
            break;
        case '}':
            c = state[--level];
            if (c == '`') {
                /* continue the parsing of the template */
                free_token(s, &s->token);
                /* Resume TOK_TEMPLATE parsing (s->token.line_num and
                 * s->token.ptr are OK) */
                s->got_lf = FALSE;
                s->last_line_num = s->token.line_num;
                if (js_parse_template_part(s, s->buf_ptr))
                    goto done;
                goto handle_template;
            } else if (c != '{') {
                goto done;
            }
            break;
        case TOK_TEMPLATE:
        handle_template:
            if (s->token.u.str.sep != '`') {
                /* '${' inside the template : closing '}' and continue
                   parsing the template */
                if (level >= sizeof(state))
                    goto done;
                state[level++] = '`';
            } 
            break;
        case TOK_EOF:
            goto done;
        case ';':
            if (level == 2) {
                bits |= SKIP_HAS_SEMI;
            }
            break;
        case TOK_ELLIPSIS:
            if (level == 2) {
                bits |= SKIP_HAS_ELLIPSIS;
            }
            break;
        case '=':
            bits |= SKIP_HAS_ASSIGNMENT;
            break;
            
        case TOK_DIV_ASSIGN:
            tok_len = 2;
            goto parse_regexp;
        case '/':
            tok_len = 1;
        parse_regexp:
            if (is_regexp_allowed(last_tok)) {
                s->buf_ptr -= tok_len;
                if (js_parse_regexp(s)) {
                    /* XXX: should clear the exception */
                    goto done;
                }
            }
            break;
        }
        /* last_tok is only used to recognize regexps */
        if (s->token.val == TOK_IDENT &&
            (token_is_pseudo_keyword(s, JS_ATOM_of) ||
             token_is_pseudo_keyword(s, JS_ATOM_yield))) {
            last_tok = TOK_OF;
        } else {
            last_tok = s->token.val;
        }
        if (next_token(s)) {
            /* XXX: should clear the exception generated by next_token() */
            break;
        }
        if (level <= 1) {
            tok = s->token.val;
            if (token_is_pseudo_keyword(s, JS_ATOM_of))
                tok = TOK_OF;
            if (no_line_terminator && s->last_line_num != s->token.line_num)
                tok = '\n';
            break;
        }
    }
 done:
    if (pbits) {
        *pbits = bits;
    }
    if (js_parse_seek_token(s, &pos))
        return -1;
    return tok;
}